

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
Shell::assertReturn(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,AssertReturn *assn)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  undefined8 uVar4;
  char cVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  HeapType HVar8;
  long lVar9;
  Literal *pLVar10;
  uint uVar11;
  Literal *pLVar12;
  ulong uVar13;
  Index index;
  int iVar14;
  Result<wasm::Ok> *pRVar15;
  bool bVar16;
  NaNResult nan;
  undefined1 auStack_3e8 [16];
  stringstream err;
  ostream local_3d0 [112];
  ios_base local_360 [264];
  _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult> local_258;
  _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult> local_238;
  Literal local_218;
  undefined1 local_200 [8];
  ActionResult result;
  Literal local_1a8;
  Literal local_190;
  Literal local_178;
  Literal local_160;
  Literal *local_148;
  char *local_140;
  Type *local_138;
  anon_class_16_2_e5cbf392 atIndex;
  Literal val;
  type *values;
  undefined1 local_f0 [8];
  Result<wasm::Ok> check;
  undefined1 local_88 [8];
  Result<wasm::Ok> check_1;
  uint local_54;
  string local_50;
  
  std::__cxx11::stringstream::stringstream((stringstream *)(auStack_3e8 + 8));
  doAction((ActionResult *)local_200,this,&assn->action);
  val.type.id = (uintptr_t)(ActionResult *)0x0;
  if (result.
      super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      ._M_u._M_first._M_storage._M_storage[0x30] == '\0') {
    val.type.id = (uintptr_t)local_200;
  }
  check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
  .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = __return_storage_ptr__;
  if (result.
      super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      ._M_u._M_first._M_storage._M_storage[0x30] == '\0') {
    if (((long)(result.
                super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                .
                super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                .
                super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                .
                super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                .
                super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                .
                super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                ._M_u._32_8_ -
               result.
               super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
               .
               super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
               .
               super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
               .
               super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
               .
               super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
               .
               super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
               ._M_u._24_8_) >> 3) * -0x5555555555555555 +
        *(long *)&(((ActionResult *)val.type.id)->
                  super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                  ).
                  super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                  .
                  super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                  .
                  super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                  .
                  super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                  .
                  super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                  ._M_u == *(long *)&assn->field_0x70 - *(long *)&assn->expected >> 5) {
      local_54 = 0;
      lVar9 = *(long *)((long)&(((ActionResult *)val.type.id)->
                               super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                               ).
                               super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                               .
                               super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                               .
                               super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                               .
                               super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                               .
                               super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                               ._M_u + 0x20);
      if ((*(long *)((long)&(((ActionResult *)val.type.id)->
                            super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                            ).
                            super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                            .
                            super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                            .
                            super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                            .
                            super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                            .
                            super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                            ._M_u + 0x28) - lVar9 >> 3) * -0x5555555555555555 +
          *(long *)&(((ActionResult *)val.type.id)->
                    super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                    ).
                    super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                    .
                    super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                    .
                    super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                    .
                    super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                    .
                    super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                    ._M_u != 0) {
        puVar6 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        local_140 = "unexpected expectation";
        uVar13 = 0;
        do {
          local_138 = &val.type;
          atIndex.values = (type **)&local_54;
          pLVar10 = (Literal *)(lVar9 + -0x18 + uVar13 * 0x18);
          if (local_54 == 0) {
            pLVar10 = (Literal *)(val.type.id + 8);
          }
          wasm::Literal::Literal((Literal *)&atIndex.i,pLVar10);
          lVar9 = *(long *)&assn->expected;
          pLVar10 = (Literal *)((ulong)local_54 * 0x20 + lVar9);
          if (lVar9 == 0) {
            pLVar12 = (Literal *)0x0;
          }
          else {
            pLVar12 = (Literal *)0x0;
            if (pLVar10[1].field_0.v128[0] == '\0') {
              pLVar12 = pLVar10;
            }
          }
          if (pLVar12 == (Literal *)0x0) {
            if (lVar9 == 0) {
              pLVar12 = (Literal *)0x0;
            }
            else {
              pLVar12 = (Literal *)0x0;
              if (pLVar10[1].field_0.v128[0] == '\x01') {
                pLVar12 = pLVar10;
              }
            }
            if (pLVar12 == (Literal *)0x0) {
              if (lVar9 == 0) {
                pLVar12 = (Literal *)0x0;
              }
              else {
                pLVar12 = (Literal *)0x0;
                if (pLVar10[1].field_0.v128[0] == '\x02') {
                  pLVar12 = pLVar10;
                }
              }
              if (pLVar12 == (Literal *)0x0) {
                if (lVar9 == 0) {
                  pLVar10 = (Literal *)0x0;
                }
                else if (pLVar10[1].field_0.v128[0] != '\x03') {
                  pLVar10 = (Literal *)0x0;
                }
                if (pLVar10 == (Literal *)0x0) {
                  uVar11 = 0x16d;
LAB_00145b3f:
                  wasm::handle_unreachable
                            (local_140,
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                             ,uVar11);
                }
                lVar9 = (long)(pLVar10->field_0).gcData.
                              super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi - (pLVar10->field_0).i64 >> 5;
                local_148 = pLVar10;
                if (lVar9 == 2) {
                  pLVar10 = (Literal *)local_f0;
                  wasm::Literal::getLanesF64x2();
                  index = 0;
                  lVar9 = 0;
                  bVar16 = false;
                  do {
                    wasm::Literal::Literal(&local_1a8,pLVar10);
                    std::__detail::__variant::
                    _Copy_ctor_base<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                     *)&local_238,
                                    (_Copy_ctor_base<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                     *)((long)(((local_148->field_0).gcData.
                                                super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->values).
                                              super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems +
                                       lVar9 + 0xfffffffffffffff0U));
                    checkLane((Result<wasm::Ok> *)local_88,this,&local_1a8,(LaneResult *)&local_238,
                              index);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                    ~_Variant_storage(&local_238);
                    wasm::Literal::~Literal(&local_1a8);
                    if (check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
                      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                         (local_3d0,(char *)local_88,
                                          check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u.
                                          _0_8_);
                      assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::
                      operator()[abi_cxx11_(&local_50,&local_138);
                      uVar4 = check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
                      paVar2 = &local_50.field_2;
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != paVar2) {
                        operator_delete(local_50._M_dataplus._M_p,
                                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                                 local_50.field_2._M_local_buf[0]) + 1);
                      }
                      std::__cxx11::stringbuf::str();
                      *(undefined8 **)uVar4 = puVar6;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p == paVar2) {
                        *puVar6 = CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                           local_50.field_2._M_local_buf[0]);
                        *(undefined8 *)
                         ((long)&(__return_storage_ptr__->val).
                                 super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
                             local_50.field_2._8_8_;
                      }
                      else {
                        *(pointer *)uVar4 = local_50._M_dataplus._M_p;
                        *(ulong *)(uVar4 + 0x10) =
                             CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                      local_50.field_2._M_local_buf[0]);
                      }
                      *(size_type *)(uVar4 + 8) = local_50._M_string_length;
                      local_50._M_string_length = 0;
                      local_50.field_2._M_local_buf[0] = '\0';
                      *(undefined1 *)(uVar4 + 0x20) = 1;
                      local_50._M_dataplus._M_p = (pointer)paVar2;
                      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
                      iVar14 = 1;
                      goto LAB_001457e0;
                    }
                    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
                    lVar9 = lVar9 + 0x20;
                    index = index + 1;
                    pLVar10 = pLVar10 + 1;
                    bVar16 = lVar9 != 0x20;
                  } while (lVar9 == 0x20);
                  iVar14 = 5;
LAB_001457e0:
                  lVar9 = 0x18;
                  do {
                    wasm::Literal::~Literal((Literal *)(local_f0 + lVar9));
                    lVar9 = lVar9 + -0x18;
                  } while (lVar9 != -0x18);
                  if (bVar16) {
LAB_00145808:
                    iVar14 = 0;
                  }
                }
                else {
                  if (lVar9 != 4) {
                    uVar11 = 0x16a;
                    local_140 = "unexpected number of lanes";
                    goto LAB_00145b3f;
                  }
                  pLVar10 = (Literal *)local_f0;
                  wasm::Literal::getLanesF32x4();
                  lVar9 = 0;
                  uVar13 = 0;
                  bVar16 = false;
                  do {
                    wasm::Literal::Literal
                              ((Literal *)
                               ((long)&result.
                                       super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                       .
                                       super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                       .
                                       super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                       .
                                       super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                       .
                                       super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                       .
                                       super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                               + 0x38),pLVar10);
                    std::__detail::__variant::
                    _Copy_ctor_base<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                     *)&local_258,
                                    (_Copy_ctor_base<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                     *)((long)(((local_148->field_0).gcData.
                                                super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->values).
                                              super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems +
                                       lVar9 + 0xfffffffffffffff0U));
                    pLVar12 = (Literal *)
                              ((long)&result.
                                      super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                      .
                                      super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                      .
                                      super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                      .
                                      super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                      .
                                      super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                      .
                                      super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                              + 0x38);
                    checkLane((Result<wasm::Ok> *)local_88,this,pLVar12,(LaneResult *)&local_258,
                              (Index)uVar13);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                    ~_Variant_storage(&local_258);
                    wasm::Literal::~Literal(pLVar12);
                    if (check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
                      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                         (local_3d0,(char *)local_88,
                                          check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u.
                                          _0_8_);
                      assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::
                      operator()[abi_cxx11_(&local_50,&local_138);
                      uVar4 = check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
                      paVar2 = &local_50.field_2;
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != paVar2) {
                        operator_delete(local_50._M_dataplus._M_p,
                                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                                 local_50.field_2._M_local_buf[0]) + 1);
                      }
                      std::__cxx11::stringbuf::str();
                      *(undefined8 **)uVar4 = puVar6;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p == paVar2) {
                        *puVar6 = CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                           local_50.field_2._M_local_buf[0]);
                        *(undefined8 *)
                         ((long)&(__return_storage_ptr__->val).
                                 super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
                             local_50.field_2._8_8_;
                      }
                      else {
                        *(pointer *)uVar4 = local_50._M_dataplus._M_p;
                        *(ulong *)(uVar4 + 0x10) =
                             CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                      local_50.field_2._M_local_buf[0]);
                      }
                      *(size_type *)(uVar4 + 8) = local_50._M_string_length;
                      local_50._M_string_length = 0;
                      local_50.field_2._M_local_buf[0] = '\0';
                      *(undefined1 *)(uVar4 + 0x20) = 1;
                      local_50._M_dataplus._M_p = (pointer)paVar2;
                      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
                      iVar14 = 1;
                      goto LAB_001458b0;
                    }
                    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
                    bVar16 = 2 < uVar13;
                    uVar13 = uVar13 + 1;
                    pLVar10 = pLVar10 + 1;
                    lVar9 = lVar9 + 0x20;
                  } while (uVar13 != 4);
                  iVar14 = 5;
LAB_001458b0:
                  lVar9 = 0x48;
                  do {
                    wasm::Literal::~Literal((Literal *)(local_f0 + lVar9));
                    lVar9 = lVar9 + -0x18;
                  } while (lVar9 != -0x18);
                  if (bVar16) goto LAB_00145808;
                }
                if (iVar14 == 0) goto LAB_00145817;
              }
              else {
                wasm::Literal::Literal(&local_218,(Literal *)&atIndex.i);
                nan._4_4_ = 0;
                nan.kind = (pLVar12->field_0).i32;
                nan.type.id = (uintptr_t)(pLVar12->field_0).func.super_IString.str._M_str;
                checkNaN((Result<wasm::Ok> *)local_f0,this,&local_218,nan);
                wasm::Literal::~Literal(&local_218);
                if (check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     (local_3d0,(char *)local_f0,
                                      check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_);
                  uVar4 = check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
                  pcVar1 = (char *)((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
                  assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::operator()[abi_cxx11_
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_88,&local_138);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,(char *)local_88,
                             check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_);
                  if (local_88 != (undefined1  [8])pcVar1) {
                    operator_delete((void *)local_88,
                                    CONCAT71(check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u.
                                             _9_7_,check_1.val.
                                                   super__Variant_base<wasm::Ok,_wasm::Err>.
                                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>
                                                   ._M_u._8_1_) + 1);
                  }
                  std::__cxx11::stringbuf::str();
                  *(undefined8 **)uVar4 = puVar6;
                  if (local_88 == (undefined1  [8])pcVar1) {
                    *puVar6 = CONCAT71(check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                                       check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_)
                    ;
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
                         check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
                  }
                  else {
                    *(undefined1 (*) [8])uVar4 = local_88;
                    *(ulong *)(uVar4 + 0x10) =
                         CONCAT71(check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                                  check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
                  }
                  *(undefined8 *)(uVar4 + 8) =
                       check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
                  check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
                  check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
                  *(undefined1 *)(uVar4 + 0x20) = 1;
                  local_88 = (undefined1  [8])pcVar1;
                  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                  ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_f0);
                  iVar14 = 1;
                }
                else {
                  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                  ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_f0);
LAB_00145817:
                  iVar14 = 0;
                }
              }
              if (iVar14 == 0) {
LAB_0014581f:
                iVar14 = 0;
              }
            }
            else {
              if (((ulong)val.field_0.func.super_IString.str._M_str & 1) == 0 &&
                  (char *)0x6 < val.field_0.func.super_IString.str._M_str) {
                HVar8 = wasm::Type::getHeapType((Type *)&val.field_0.func.super_IString.str._M_str);
                cVar5 = wasm::HeapType::isSubType(HVar8,(HeapType)(pLVar12->field_0).i64);
                if (cVar5 != '\0') goto LAB_0014581f;
              }
              std::__ostream_insert<char,std::char_traits<char>>(local_3d0,"expected ",9);
              poVar7 = (ostream *)wasm::operator<<(local_3d0,(HeapType)(pLVar12->field_0).i64);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," reference, got ",0x10);
              wasm::Literal::Literal(&local_160,(Literal *)&atIndex.i);
              poVar7 = (ostream *)wasm::operator<<(poVar7,_auStack_3e8);
              assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::operator()[abi_cxx11_
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0,&local_138);
              uVar4 = check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
              pcVar1 = (char *)((long)&check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,(char *)local_f0,
                         check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_);
              if (local_f0 != (undefined1  [8])pcVar1) {
                operator_delete((void *)local_f0,
                                check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ + 1);
              }
              wasm::Literal::~Literal(&local_160);
              std::__cxx11::stringbuf::str();
              *(undefined8 **)uVar4 = puVar6;
              if (local_f0 == (undefined1  [8])pcVar1) {
                *puVar6 = check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
                     check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
              }
              else {
                *(undefined1 (*) [8])uVar4 = local_f0;
                *(undefined8 *)(uVar4 + 0x10) =
                     check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
              }
              *(undefined8 *)(uVar4 + 8) =
                   check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
              check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
              check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ =
                   check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ & 0xffffffffffffff00
              ;
              *(undefined1 *)(uVar4 + 0x20) = 1;
              iVar14 = 1;
              local_f0 = (undefined1  [8])pcVar1;
            }
            if (iVar14 == 0) goto LAB_00145827;
          }
          else {
            cVar5 = wasm::Literal::operator!=((Literal *)&atIndex.i,pLVar12);
            if (cVar5 == '\0') {
LAB_00145827:
              iVar14 = 0;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>(local_3d0,"expected ",9);
              wasm::Literal::Literal(&local_190,pLVar12);
              poVar7 = (ostream *)wasm::operator<<(local_3d0,_auStack_3e8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", got ",6);
              wasm::Literal::Literal(&local_178,(Literal *)&atIndex.i);
              poVar7 = (ostream *)wasm::operator<<(poVar7,_auStack_3e8);
              uVar4 = check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
              pcVar1 = (char *)((long)&check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
              assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::operator()[abi_cxx11_
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0,&local_138);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,(char *)local_f0,
                         check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_);
              if (local_f0 != (undefined1  [8])pcVar1) {
                operator_delete((void *)local_f0,
                                check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ + 1);
              }
              wasm::Literal::~Literal(&local_178);
              wasm::Literal::~Literal(&local_190);
              std::__cxx11::stringbuf::str();
              *(undefined8 **)uVar4 = puVar6;
              if (local_f0 == (undefined1  [8])pcVar1) {
                *puVar6 = check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
                     check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
              }
              else {
                *(undefined1 (*) [8])uVar4 = local_f0;
                *(undefined8 *)(uVar4 + 0x10) =
                     check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
              }
              *(undefined8 *)(uVar4 + 8) =
                   check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
              check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
              check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ =
                   check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ & 0xffffffffffffff00
              ;
              *(undefined1 *)(uVar4 + 0x20) = 1;
              iVar14 = 1;
              local_f0 = (undefined1  [8])pcVar1;
            }
          }
          wasm::Literal::~Literal((Literal *)&atIndex.i);
          if (iVar14 != 0) goto LAB_00145ad6;
          local_54 = local_54 + 1;
          uVar13 = (ulong)local_54;
          lVar9 = *(long *)(val.type.id + 0x20);
        } while (uVar13 < (ulong)((*(long *)(val.type.id + 0x28) - lVar9 >> 3) * -0x5555555555555555
                                 + *(long *)val.type.id));
        iVar14 = 2;
LAB_00145ad6:
        pRVar15 = (Result<wasm::Ok> *)
                  check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
        if (iVar14 != 2) goto LAB_00145ae5;
      }
      *(undefined1 *)
       (check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x20) = 0;
      pRVar15 = (Result<wasm::Ok> *)
                check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(local_3d0,"expected ",9);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," values, got ",0xd);
      resultToString_abi_cxx11_((string *)local_f0,this,(ActionResult *)local_200);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,(char *)local_f0,
                 check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_);
      pcVar1 = (char *)((long)&check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
      if (local_f0 != (undefined1  [8])pcVar1) {
        operator_delete((void *)local_f0,
                        check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ + 1);
      }
      std::__cxx11::stringbuf::str();
      puVar6 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar6;
      if (local_f0 == (undefined1  [8])pcVar1) {
        *puVar6 = check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
             check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_f0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
           check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
      check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
      check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ =
           check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ & 0xffffffffffffff00;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      pRVar15 = __return_storage_ptr__;
      local_f0 = (undefined1  [8])pcVar1;
    }
    goto LAB_00145ae5;
  }
  pcVar1 = (char *)((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
  local_88 = (undefined1  [8])pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"expected return, got ","");
  resultToString_abi_cxx11_(&local_50,this,(ActionResult *)local_200);
  uVar13 = 0xf;
  if (local_88 != (undefined1  [8])pcVar1) {
    uVar13 = CONCAT71(check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                      check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
  }
  if (uVar13 < local_50._M_string_length +
               check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar13 = CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                        local_50.field_2._M_local_buf[0]);
    }
    if (uVar13 < local_50._M_string_length +
                 check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_) goto LAB_00144f8e;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_88);
  }
  else {
LAB_00144f8e:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append(local_88,(ulong)local_50._M_dataplus._M_p);
  }
  local_f0 = (undefined1  [8])
             ((long)&check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
  pcVar3 = (char *)(puVar6 + 2);
  if ((char *)*puVar6 == pcVar3) {
    check.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
    .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _M_u._8_8_ = *(undefined8 *)pcVar3;
    check.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
    .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _M_u._16_8_ = puVar6[3];
  }
  else {
    check.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
    .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _M_u._8_8_ = *(undefined8 *)pcVar3;
    local_f0 = (undefined1  [8])*puVar6;
  }
  uVar4 = puVar6[1];
  *puVar6 = pcVar3;
  puVar6[1] = 0;
  *pcVar3 = '\0';
  *(undefined8 **)
   check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
   super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ =
       (undefined8 *)
       (check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10);
  pcVar3 = (char *)((long)&check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
  if (local_f0 == (undefined1  [8])pcVar3) {
    *(undefined8 *)
     (check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10) =
         check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
    *(undefined8 *)
     (check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x18) =
         check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
  }
  else {
    *(undefined1 (*) [8])
     check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
     super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = local_f0;
    *(undefined8 *)
     (check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10) =
         check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
  }
  *(undefined8 *)
   (check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 8) = uVar4;
  check.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._0_8_ = 0;
  check.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._8_8_ = check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ & 0xffffffffffffff00;
  *(undefined1 *)
   (check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x20) = 1;
  local_f0 = (undefined1  [8])pcVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  pRVar15 = (Result<wasm::Ok> *)
            check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  if (local_88 != (undefined1  [8])pcVar1) {
    operator_delete((void *)local_88,
                    CONCAT71(check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                             check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_) + 1);
    pRVar15 = (Result<wasm::Ok> *)
              check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  }
LAB_00145ae5:
  std::__detail::__variant::
  _Variant_storage<false,_wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
  ::~_Variant_storage((_Variant_storage<false,_wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       *)local_200);
  std::__cxx11::stringstream::~stringstream((stringstream *)(auStack_3e8 + 8));
  std::ios_base::~ios_base(local_360);
  return pRVar15;
}

Assistant:

Result<> assertReturn(AssertReturn& assn) {
    std::stringstream err;
    auto result = doAction(assn.action);
    auto* values = std::get_if<Literals>(&result);
    if (!values) {
      return Err{std::string("expected return, got ") + resultToString(result)};
    }
    if (values->size() != assn.expected.size()) {
      err << "expected " << assn.expected.size() << " values, got "
          << resultToString(result);
      return Err{err.str()};
    }
    for (Index i = 0; i < values->size(); ++i) {
      auto atIndex = [&]() {
        if (values->size() <= 1) {
          return std::string{};
        }
        std::stringstream ss;
        ss << " at index " << i;
        return ss.str();
      };

      Literal val = (*values)[i];
      auto& expected = assn.expected[i];
      if (auto* v = std::get_if<Literal>(&expected)) {
        if (val != *v) {
          err << "expected " << *v << ", got " << val << atIndex();
          return Err{err.str()};
        }
      } else if (auto* ref = std::get_if<RefResult>(&expected)) {
        if (!val.type.isRef() ||
            !HeapType::isSubType(val.type.getHeapType(), ref->type)) {
          err << "expected " << ref->type << " reference, got " << val
              << atIndex();
          return Err{err.str()};
        }
      } else if (auto* nan = std::get_if<NaNResult>(&expected)) {
        auto check = checkNaN(val, *nan);
        if (auto* e = check.getErr()) {
          err << e->msg << atIndex();
          return Err{err.str()};
        }
      } else if (auto* lanes = std::get_if<LaneResults>(&expected)) {
        switch (lanes->size()) {
          case 4: {
            auto vals = val.getLanesF32x4();
            for (Index i = 0; i < 4; ++i) {
              auto check = checkLane(vals[i], (*lanes)[i], i);
              if (auto* e = check.getErr()) {
                err << e->msg << atIndex();
                return Err{err.str()};
              }
            }
            break;
          }
          case 2: {
            auto vals = val.getLanesF64x2();
            for (Index i = 0; i < 2; ++i) {
              auto check = checkLane(vals[i], (*lanes)[i], i);
              if (auto* e = check.getErr()) {
                err << e->msg << atIndex();
                return Err{err.str()};
              }
            }
            break;
          }
          default:
            WASM_UNREACHABLE("unexpected number of lanes");
        }
      } else {
        WASM_UNREACHABLE("unexpected expectation");
      }
    }
    return Ok{};
  }